

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O2

BOOL __thiscall
LASreadItemCompressed_POINT14_v4::createAndInitModelsAndDecompressors
          (LASreadItemCompressed_POINT14_v4 *this,U32 context,U8 *item)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ArithmeticModel *pAVar7;
  long lVar8;
  IntegerCompressor *pIVar9;
  
  if (this->contexts[context].unused != false) {
    pAVar7 = this->contexts[context].m_changed_values[0];
    if (pAVar7 == (ArithmeticModel *)0x0) {
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[0] = pAVar7;
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[1] = pAVar7;
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[2] = pAVar7;
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[3] = pAVar7;
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[4] = pAVar7;
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[5] = pAVar7;
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[6] = pAVar7;
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[7] = pAVar7;
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,3);
      this->contexts[context].m_scanner_channel = pAVar7;
      for (lVar8 = -0x80; lVar8 != 0; lVar8 = lVar8 + 8) {
        *(undefined8 *)((long)this->contexts[context].m_return_number + lVar8 + -8) = 0;
        *(undefined8 *)((long)this->contexts[context].m_classification + lVar8 + -0x18) = 0;
      }
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0xd);
      this->contexts[context].m_return_number_gps_same = pAVar7;
      pIVar9 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar9,this->dec_channel_returns_XY,0x20,2,8,0);
      this->contexts[context].ic_dX = pIVar9;
      pIVar9 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar9,this->dec_channel_returns_XY,0x20,0x16,8,0);
      this->contexts[context].ic_dY = pIVar9;
      pIVar9 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar9,this->dec_Z,0x20,0x14,8,0);
      this->contexts[context].ic_Z = pIVar9;
      for (lVar8 = -0x200; lVar8 != 0; lVar8 = lVar8 + 8) {
        *(undefined8 *)((long)this->contexts[context].m_flags + lVar8) = 0;
        *(undefined8 *)((long)this->contexts[context].m_user_data + lVar8) = 0;
        *(undefined8 *)((long)this->contexts[context].last_gpstime + lVar8 + -0x20) = 0;
      }
      pIVar9 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar9,this->dec_intensity,0x10,4,8,0);
      this->contexts[context].ic_intensity = pIVar9;
      pIVar9 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar9,this->dec_scan_angle,0x10,2,8,0);
      this->contexts[context].ic_scan_angle = pIVar9;
      pIVar9 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar9,this->dec_point_source,0x10,1,8,0);
      this->contexts[context].ic_point_source_ID = pIVar9;
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_gps_time,0x203);
      this->contexts[context].m_gpstime_multi = pAVar7;
      pAVar7 = ArithmeticDecoder::createSymbolModel(this->dec_gps_time,5);
      this->contexts[context].m_gpstime_0diff = pAVar7;
      pIVar9 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar9,this->dec_gps_time,0x20,9,8,0);
      this->contexts[context].ic_gpstime = pIVar9;
      pAVar7 = this->contexts[context].m_changed_values[0];
    }
    ArithmeticDecoder::initSymbolModel(this->dec_channel_returns_XY,pAVar7,(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[1],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[2],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[3],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[4],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[5],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[6],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[7],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_scanner_channel,(U32 *)0x0);
    for (lVar8 = -0x80; lVar8 != 0; lVar8 = lVar8 + 8) {
      pAVar7 = *(ArithmeticModel **)((long)this->contexts[context].m_return_number + lVar8 + -8);
      if (pAVar7 != (ArithmeticModel *)0x0) {
        ArithmeticDecoder::initSymbolModel(this->dec_channel_returns_XY,pAVar7,(U32 *)0x0);
      }
      pAVar7 = *(ArithmeticModel **)((long)this->contexts[context].m_classification + lVar8 + -0x18)
      ;
      if (pAVar7 != (ArithmeticModel *)0x0) {
        ArithmeticDecoder::initSymbolModel(this->dec_channel_returns_XY,pAVar7,(U32 *)0x0);
      }
    }
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_return_number_gps_same,
               (U32 *)0x0);
    IntegerCompressor::initDecompressor(this->contexts[context].ic_dX);
    IntegerCompressor::initDecompressor(this->contexts[context].ic_dY);
    for (lVar8 = -0x120; lVar8 != 0; lVar8 = lVar8 + 0x18) {
      puVar1 = (undefined8 *)((long)this->contexts[context].last_Y_diff_median5[0].values + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)this->contexts[context].last_Y_diff_median5[0].values + lVar8 + 0x10) =
           0;
      *(undefined1 *)((long)this->contexts[context].last_Y_diff_median5[0].values + lVar8 + 0x14) =
           1;
      *(undefined4 *)((long)this->contexts[context].last_Z + lVar8 + 0x10) = 0;
      puVar1 = (undefined8 *)((long)this->contexts[context].last_Z + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined1 *)((long)this->contexts[context].last_Z + lVar8 + 0x14) = 1;
    }
    IntegerCompressor::initDecompressor(this->contexts[context].ic_Z);
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      this->contexts[context].last_Z[lVar8] = *(I32 *)(item + 8);
    }
    for (lVar8 = -0x200; lVar8 != 0; lVar8 = lVar8 + 8) {
      pAVar7 = *(ArithmeticModel **)((long)this->contexts[context].m_flags + lVar8);
      if (pAVar7 != (ArithmeticModel *)0x0) {
        ArithmeticDecoder::initSymbolModel(this->dec_classification,pAVar7,(U32 *)0x0);
      }
      pAVar7 = *(ArithmeticModel **)((long)this->contexts[context].m_user_data + lVar8);
      if (pAVar7 != (ArithmeticModel *)0x0) {
        ArithmeticDecoder::initSymbolModel(this->dec_flags,pAVar7,(U32 *)0x0);
      }
      pAVar7 = *(ArithmeticModel **)((long)this->contexts[context].last_gpstime + lVar8 + -0x20);
      if (pAVar7 != (ArithmeticModel *)0x0) {
        ArithmeticDecoder::initSymbolModel(this->dec_user_data,pAVar7,(U32 *)0x0);
      }
    }
    IntegerCompressor::initDecompressor(this->contexts[context].ic_intensity);
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      this->contexts[context].last_intensity[lVar8] = *(U16 *)(item + 0xc);
    }
    IntegerCompressor::initDecompressor(this->contexts[context].ic_scan_angle);
    IntegerCompressor::initDecompressor(this->contexts[context].ic_point_source_ID);
    ArithmeticDecoder::initSymbolModel
              (this->dec_gps_time,this->contexts[context].m_gpstime_multi,(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_gps_time,this->contexts[context].m_gpstime_0diff,(U32 *)0x0);
    IntegerCompressor::initDecompressor(this->contexts[context].ic_gpstime);
    this->contexts[context].last = 0;
    this->contexts[context].next = 0;
    this->contexts[context].last_gpstime_diff[0] = 0;
    this->contexts[context].last_gpstime_diff[1] = 0;
    this->contexts[context].last_gpstime_diff[2] = 0;
    this->contexts[context].last_gpstime_diff[3] = 0;
    this->contexts[context].multi_extreme_counter[0] = 0;
    this->contexts[context].multi_extreme_counter[1] = 0;
    this->contexts[context].multi_extreme_counter[2] = 0;
    this->contexts[context].multi_extreme_counter[3] = 0;
    this->contexts[context].last_gpstime[0] = *(U64I64F64 *)(item + 0x20);
    this->contexts[context].last_gpstime[1].u64 = 0;
    this->contexts[context].last_gpstime[2].u64 = 0;
    this->contexts[context].last_gpstime[3].u64 = 0;
    uVar2 = *(undefined8 *)item;
    uVar3 = *(undefined8 *)(item + 8);
    uVar4 = *(undefined8 *)(item + 0x18);
    uVar5 = *(undefined8 *)(item + 0x20);
    uVar6 = *(undefined8 *)(item + 0x28);
    *(undefined8 *)(this->contexts[context].last_item + 0x10) = *(undefined8 *)(item + 0x10);
    *(undefined8 *)(this->contexts[context].last_item + 0x18) = uVar4;
    *(undefined8 *)this->contexts[context].last_item = uVar2;
    *(undefined8 *)(this->contexts[context].last_item + 8) = uVar3;
    *(undefined8 *)(this->contexts[context].last_item + 0x20) = uVar5;
    *(undefined8 *)(this->contexts[context].last_item + 0x28) = uVar6;
    this->contexts[context].last_item[0x1c] = '\0';
    this->contexts[context].unused = false;
    return true;
  }
  __assert_fail("contexts[context].unused",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v4.cpp"
                ,0xe8,
                "BOOL LASreadItemCompressed_POINT14_v4::createAndInitModelsAndDecompressors(U32, const U8 *)"
               );
}

Assistant:

inline BOOL LASreadItemCompressed_POINT14_v4::createAndInitModelsAndDecompressors(U32 context, const U8* item)
{
  I32 i;

  /* should only be called when context is unused */

  assert(contexts[context].unused);

  /* first create all entropy models and integer decompressors (if needed) */

  if (contexts[context].m_changed_values[0] == 0)
  {
    /* for the channel_returns_XY layer */

    contexts[context].m_changed_values[0] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[1] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[2] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[3] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[4] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[5] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[6] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[7] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_scanner_channel = dec_channel_returns_XY->createSymbolModel(3);
    for (i = 0; i < 16; i++)
    {
      contexts[context].m_number_of_returns[i] = 0;
      contexts[context].m_return_number[i] = 0;
    }
    contexts[context].m_return_number_gps_same = dec_channel_returns_XY->createSymbolModel(13);

    contexts[context].ic_dX = new IntegerCompressor(dec_channel_returns_XY, 32, 2);  // 32 bits, 2 context
    contexts[context].ic_dY = new IntegerCompressor(dec_channel_returns_XY, 32, 22); // 32 bits, 22 contexts

    /* for the Z layer */

    contexts[context].ic_Z = new IntegerCompressor(dec_Z, 32, 20);  // 32 bits, 20 contexts

    /* for the classification layer */
    /* for the flags layer */
    /* for the user_data layer */

    for (i = 0; i < 64; i++)
    {
      contexts[context].m_classification[i] = 0;
      contexts[context].m_flags[i] = 0;
      contexts[context].m_user_data[i] = 0;
    }

    /* for the intensity layer */

    contexts[context].ic_intensity = new IntegerCompressor(dec_intensity, 16, 4);

    /* for the scan_angle layer */

    contexts[context].ic_scan_angle = new IntegerCompressor(dec_scan_angle, 16, 2);

    /* for the point_source_ID layer */

    contexts[context].ic_point_source_ID = new IntegerCompressor(dec_point_source, 16);

    /* for the gps_time layer */

    contexts[context].m_gpstime_multi = dec_gps_time->createSymbolModel(LASZIP_GPSTIME_MULTI_TOTAL);
    contexts[context].m_gpstime_0diff = dec_gps_time->createSymbolModel(5);
    contexts[context].ic_gpstime = new IntegerCompressor(dec_gps_time, 32, 9); // 32 bits, 9 contexts
  }

  /* then init entropy models and integer compressors */

  /* for the channel_returns_XY layer */

  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[0]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[1]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[2]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[3]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[4]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[5]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[6]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[7]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_scanner_channel);
  for (i = 0; i < 16; i++)
  {
    if (contexts[context].m_number_of_returns[i]) dec_channel_returns_XY->initSymbolModel(contexts[context].m_number_of_returns[i]);
    if (contexts[context].m_return_number[i]) dec_channel_returns_XY->initSymbolModel(contexts[context].m_return_number[i]);
  }
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_return_number_gps_same);
  contexts[context].ic_dX->initDecompressor();
  contexts[context].ic_dY->initDecompressor();
  for (i = 0; i < 12; i++)
  {
    contexts[context].last_X_diff_median5[i].init();
    contexts[context].last_Y_diff_median5[i].init();
  }

  /* for the Z layer */

  contexts[context].ic_Z->initDecompressor();
  for (i = 0; i < 8; i++)
  {
    contexts[context].last_Z[i] = ((const LASpoint14*)item)->Z;
  }

  /* for the classification layer */
  /* for the flags layer */
  /* for the user_data layer */

  for (i = 0; i < 64; i++)
  {
    if (contexts[context].m_classification[i]) dec_classification->initSymbolModel(contexts[context].m_classification[i]);
    if (contexts[context].m_flags[i]) dec_flags->initSymbolModel(contexts[context].m_flags[i]);
    if (contexts[context].m_user_data[i]) dec_user_data->initSymbolModel(contexts[context].m_user_data[i]);
  }

  /* for the intensity layer */

  contexts[context].ic_intensity->initDecompressor();
  for (i = 0; i < 8; i++)
  {
    contexts[context].last_intensity[i] = ((const LASpoint14*)item)->intensity;
  }

  /* for the scan_angle layer */

  contexts[context].ic_scan_angle->initDecompressor();

  /* for the point_source_ID layer */

  contexts[context].ic_point_source_ID->initDecompressor();

  /* for the gps_time layer */

  dec_gps_time->initSymbolModel(contexts[context].m_gpstime_multi);
  dec_gps_time->initSymbolModel(contexts[context].m_gpstime_0diff);
  contexts[context].ic_gpstime->initDecompressor();
  contexts[context].last = 0, contexts[context].next = 0;
  contexts[context].last_gpstime_diff[0] = 0;
  contexts[context].last_gpstime_diff[1] = 0;
  contexts[context].last_gpstime_diff[2] = 0;
  contexts[context].last_gpstime_diff[3] = 0;
  contexts[context].multi_extreme_counter[0] = 0;
  contexts[context].multi_extreme_counter[1] = 0;
  contexts[context].multi_extreme_counter[2] = 0;
  contexts[context].multi_extreme_counter[3] = 0;
  contexts[context].last_gpstime[0].f64 = ((const LASpoint14*)item)->gps_time;
  contexts[context].last_gpstime[1].u64 = 0;
  contexts[context].last_gpstime[2].u64 = 0;
  contexts[context].last_gpstime[3].u64 = 0;

  /* init current context from last item */

  memcpy(contexts[context].last_item, item, sizeof(LASpoint14));
  ((LASpoint14*)contexts[context].last_item)->gps_time_change = FALSE;

//  LASMessage(LAS_VERBOSE, "INIT: current_context %d last item %.14g %d %d %d %d %d %d", current_context, ((LASpoint14*)item)->gps_time, ((LASpoint14*)item)->X, ((LASpoint14*)item)->Y, ((LASpoint14*)item)->Z, ((LASpoint14*)item)->intensity, ((LASpoint14*)item)->return_number, ((LASpoint14*)item)->number_of_returns);

  contexts[context].unused = FALSE;

  return TRUE;
}